

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  int i_start;
  int i_stop;
  
  pIVar1 = GImGui;
  if ((GImGui->NavWindowingTarget->Flags & 0x8000000) != 0) {
    return;
  }
  i_stop = (int)GImGui->NavWindowingTarget->FocusOrder;
  pIVar2 = FindWindowNavFocusable(i_stop + focus_change_dir,-0x7fffffff,focus_change_dir);
  if (pIVar2 == (ImGuiWindow *)0x0) {
    i_start = 0;
    if (focus_change_dir < 0) {
      i_start = (pIVar1->WindowsFocusOrder).Size + -1;
    }
    pIVar2 = FindWindowNavFocusable(i_start,i_stop,focus_change_dir);
    if (pIVar2 == (ImGuiWindow *)0x0) goto LAB_001d55aa;
  }
  pIVar1->NavWindowingTargetAnim = pIVar2;
  pIVar1->NavWindowingTarget = pIVar2;
  (pIVar1->NavWindowingAccumDeltaPos).x = 0.0;
  (pIVar1->NavWindowingAccumDeltaPos).y = 0.0;
  (pIVar1->NavWindowingAccumDeltaSize).x = 0.0;
  (pIVar1->NavWindowingAccumDeltaSize).y = 0.0;
LAB_001d55aa:
  pIVar1->NavWindowingToggleLayer = false;
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = ImGui::FindWindowFocusIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavFocusable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavFocusable((focus_change_dir < 0) ? (g.WindowsFocusOrder.Size - 1) : 0, i_current, focus_change_dir);
    if (window_target) // Don't reset windowing target if there's a single window in the list
    {
        g.NavWindowingTarget = g.NavWindowingTargetAnim = window_target;
        g.NavWindowingAccumDeltaPos = g.NavWindowingAccumDeltaSize = ImVec2(0.0f, 0.0f);
    }
    g.NavWindowingToggleLayer = false;
}